

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86.cpp
# Opt level: O2

int __thiscall
ncnn::HardSwish_x86::forward_inplace(HardSwish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  undefined1 auVar4 [16];
  void *pvVar5;
  int iVar6;
  long lVar7;
  int q;
  int iVar8;
  int iVar9;
  int iVar10;
  float *pfVar11;
  bool bVar12;
  float fVar13;
  undefined1 auVar14 [16];
  Mat local_78;
  
  iVar9 = bottom_top_blob->h * bottom_top_blob->w;
  iVar8 = 0;
  if (iVar9 < 1) {
    iVar9 = iVar8;
  }
  iVar10 = bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    iVar10 = iVar8;
  }
  if (bottom_top_blob->elempack == 4) {
    for (iVar8 = 0; iVar8 != iVar10; iVar8 = iVar8 + 1) {
      ncnn::Mat::channel(&local_78,bottom_top_blob,iVar8);
      pfVar11 = (float *)local_78.data;
      ncnn::Mat::~Mat(&local_78);
      auVar4 = _DAT_002db830;
      pp_Var2 = this->_vptr_HardSwish_x86;
      iVar6 = iVar9;
      while (bVar12 = iVar6 != 0, iVar6 = iVar6 + -1, bVar12) {
        fVar1 = *(float *)(&this->field_0xd0 + (long)pp_Var2[-3]);
        fVar13 = *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
        auVar14._0_4_ = fVar1 * *pfVar11 + fVar13;
        auVar14._4_4_ = fVar1 * pfVar11[1] + fVar13;
        auVar14._8_4_ = fVar1 * pfVar11[2] + fVar13;
        auVar14._12_4_ = fVar1 * pfVar11[3] + fVar13;
        auVar14 = maxps(auVar14,ZEXT816(0));
        auVar14 = minps(auVar14,auVar4);
        *pfVar11 = auVar14._0_4_ * *pfVar11;
        pfVar11[1] = auVar14._4_4_ * pfVar11[1];
        pfVar11[2] = auVar14._8_4_ * pfVar11[2];
        pfVar11[3] = auVar14._12_4_ * pfVar11[3];
        pfVar11 = pfVar11 + 4;
      }
    }
  }
  else {
    for (; iVar8 != iVar10; iVar8 = iVar8 + 1) {
      ncnn::Mat::channel(&local_78,bottom_top_blob,iVar8);
      pvVar5 = local_78.data;
      ncnn::Mat::~Mat(&local_78);
      pp_Var2 = this->_vptr_HardSwish_x86;
      for (lVar7 = 0; iVar9 != (int)lVar7; lVar7 = lVar7 + 1) {
        fVar1 = *(float *)((long)pvVar5 + lVar7 * 4);
        p_Var3 = pp_Var2[-3];
        fVar13 = 0.0;
        if (fVar1 < *(float *)(&this->field_0xd8 + (long)p_Var3)) {
LAB_002c35ea:
          *(float *)((long)pvVar5 + lVar7 * 4) = fVar13;
        }
        else if (fVar1 < *(float *)(&this->field_0xdc + (long)p_Var3) ||
                 fVar1 == *(float *)(&this->field_0xdc + (long)p_Var3)) {
          fVar13 = (*(float *)(&this->field_0xd0 + (long)p_Var3) * fVar1 +
                   *(float *)(&this->field_0xd4 + (long)p_Var3)) * fVar1;
          goto LAB_002c35ea;
        }
      }
    }
  }
  return 0;
}

Assistant:

int HardSwish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _zero = _mm256_set1_ps(0.f);
            __m256 _one = _mm256_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ans = _mm256_set1_ps(beta);
                _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
                _ans = _mm256_max_ps(_ans, _zero);
                _ans = _mm256_min_ps(_ans, _one);
                _ans = _mm256_mul_ps(_ans, _p);
                _mm256_storeu_ps(ptr, _ans);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _zero = _mm_set1_ps(0.f);
            __m128 _one = _mm_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _ans = _mm_set1_ps(beta);
                _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
                _ans = _mm_max_ps(_ans, _zero);
                _ans = _mm_min_ps(_ans, _one);
                _ans = _mm_mul_ps(_ans, _p);
                _mm_storeu_ps(ptr, _ans);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __AVX__
        __m256 _zero = _mm256_set1_ps(0.f);
        __m256 _one = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero);
            _ans = _mm256_min_ps(_ans, _one);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);

            ptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ++ptr;
        }
    }

    return 0;
}